

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManPrintStats(Lf_Man_t *p,char *pTitle)

{
  long lVar1;
  int iVar2;
  long lVar3;
  timespec ts;
  timespec local_20;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ");
    printf("Level =%6lu   ",p->pPars->Delay);
    printf("Area =%9lu   ",p->pPars->Area);
    printf("Edge =%9lu   ",p->pPars->Edge);
    printf("LUT =%9lu  ",(long)p->nInverters + p->pPars->Area);
    if ((p->vSwitches).nSize != 0) {
      printf("Swt =%8.1f  ",p->Switches);
    }
    if (p->pPars->fUseMux7 != 0) {
      printf("Mux7 =%7lu  ",p->pPars->Mux7);
    }
    iVar2 = clock_gettime(3,&local_20);
    if (iVar2 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
    }
    lVar1 = p->clkStart;
    Abc_Print(1,"%s =","Time");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar3 - lVar1) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Lf_ManPrintStats( Lf_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Level =%6lu   ",   p->pPars->Delay );
    printf( "Area =%9lu   ",    p->pPars->Area );
    printf( "Edge =%9lu   ",    p->pPars->Edge );
    printf( "LUT =%9lu  ",      p->pPars->Area+p->nInverters );
    if ( Vec_FltSize(&p->vSwitches) )
        printf( "Swt =%8.1f  ", p->Switches );
    if ( p->pPars->fUseMux7 )
        printf( "Mux7 =%7lu  ", p->pPars->Mux7 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}